

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildFloat1Int1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  IRType type;
  bool bVar2;
  ValueType valueType;
  undefined4 *puVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *instr;
  int iVar4;
  undefined6 in_register_00000032;
  OpCode opcode;
  
  iVar4 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar4 == 0x2d) {
    this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
    opcode = Reinterpret_Prim;
    goto LAB_004bcc19;
  }
  if (iVar4 == 0x40) {
LAB_004bcba3:
    type = TyUint32;
  }
  else {
    if (iVar4 != 0xd5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0xb3e,
                         "(newOpcode == Js::OpCodeAsmJs::Fround_Int || newOpcode == Js::OpCodeAsmJs::Conv_UTF || newOpcode == Js::OpCodeAsmJs::Reinterpret_ITF)"
                         ,
                         "newOpcode == Js::OpCodeAsmJs::Fround_Int || newOpcode == Js::OpCodeAsmJs::Conv_UTF || newOpcode == Js::OpCodeAsmJs::Reinterpret_ITF"
                        );
      if (!bVar2) {
LAB_004bcc7c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      if (newOpcode == Conv_UTF) goto LAB_004bcba3;
      if (newOpcode != Fround_Int) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0xb4f,"((0))","(0)");
        if (bVar2) {
          *puVar3 = 0;
          opcode = Conv_Prim;
          this_00 = (RegOpnd *)0x0;
          goto LAB_004bcc19;
        }
        goto LAB_004bcc7c;
      }
    }
    type = TyInt32;
  }
  this_00 = BuildSrcOpnd(this,srcRegSlot,type);
  opcode = Conv_Prim;
LAB_004bcc19:
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x108);
  instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildFloat1Int1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    Assert(newOpcode == Js::OpCodeAsmJs::Fround_Int || newOpcode == Js::OpCodeAsmJs::Conv_UTF || newOpcode == Js::OpCodeAsmJs::Reinterpret_ITF);

    Js::OpCode op = Js::OpCode::Conv_Prim;
    IR::RegOpnd * srcOpnd = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Fround_Int:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
        break;
    case Js::OpCodeAsmJs::Conv_UTF:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyUint32);
        break;
    case Js::OpCodeAsmJs::Reinterpret_ITF:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
        op = Js::OpCode::Reinterpret_Prim;
        break;
    default:
        Assume(UNREACHED);
    }

    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
    dstOpnd->SetValueType(ValueType::Float);

    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}